

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_adaptor_sign
              (secp256k1_context *ctx,uchar *adaptor_sig65,uchar *adaptor_proof97,uchar *seckey32,
              secp256k1_pubkey *adaptor,uchar *msg32)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  bool bVar34;
  uchar *puVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  secp256k1_ecmult_gen_context *ctx_00;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  secp256k1_scalar k;
  secp256k1_scalar sk;
  secp256k1_scalar k_1;
  uchar nonce32 [32];
  uchar nonce32_1 [32];
  secp256k1_ge r;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_scalar sp;
  secp256k1_ge adaptor_ge;
  secp256k1_scalar msg;
  uchar buf32 [32];
  uchar key32 [32];
  uchar buf33 [33];
  secp256k1_ge rp;
  int overflow;
  secp256k1_sha256 sha;
  uint64_t l [8];
  secp256k1_gej rpj;
  secp256k1_gej rj;
  secp256k1_ge r2;
  secp256k1_scalar local_648;
  uchar *local_620;
  secp256k1_sha256 local_618;
  secp256k1_scalar local_5a8;
  uchar local_588 [32];
  uchar local_568 [32];
  secp256k1_gej local_548;
  secp256k1_scalar local_4c0;
  secp256k1_scalar local_4a0;
  secp256k1_ge local_480;
  secp256k1_ge local_428;
  secp256k1_ge local_3d0;
  uchar local_378 [32];
  uchar local_358 [32];
  uchar local_338 [48];
  secp256k1_gej local_308;
  secp256k1_ge local_288;
  secp256k1_sha256 local_230;
  uint64_t local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  secp256k1_gej local_188;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_5();
  }
  else if (adaptor_sig65 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_4();
  }
  else if (adaptor_proof97 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_3();
  }
  else if (adaptor == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_adaptor_sign_cold_2();
  }
  else {
    if (msg32 != (uchar *)0x0) {
      local_230.s[0] = 0x6a09e667;
      local_230.s[1] = 0xbb67ae85;
      local_230.s[2] = 0x3c6ef372;
      local_230.s[3] = 0xa54ff53a;
      local_230.s[4] = 0x510e527f;
      local_230.s[5] = 0x9b05688c;
      local_230.s[6] = 0x1f83d9ab;
      local_230.s[7] = 0x5be0cd19;
      local_230.bytes = 0;
      secp256k1_sha256_write(&local_230,msg32,0x20);
      iVar36 = secp256k1_pubkey_load(ctx,&local_428,adaptor);
      if (iVar36 == 0) {
        return 0;
      }
      local_620 = adaptor_sig65;
      secp256k1_dleq_serialize_point(local_338,&local_428);
      secp256k1_sha256_write(&local_230,local_338,0x21);
      secp256k1_sha256_finalize(&local_230,local_338);
      iVar36 = nonce_function_dleq(local_588,local_338,seckey32,(uchar *)"ECDSAAdaptorNon");
      if (iVar36 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_648,local_588,(int *)0x0);
      if (((local_648.d[1] == 0 && local_648.d[0] == 0) && local_648.d[2] == 0) &&
          local_648.d[3] == 0) {
        return 0;
      }
      ctx_00 = &ctx->ecmult_gen_ctx;
      secp256k1_ecmult_gen(ctx_00,&local_188,&local_648);
      secp256k1_ecmult_const(&local_108,&local_428,&local_648,0x100);
      secp256k1_ecmult_gen(ctx_00,&local_548,&local_648);
      secp256k1_ge_set_gej(&local_3d0,&local_548);
      secp256k1_ecmult_const(&local_308,&local_428,&local_648,0x100);
      secp256k1_ge_set_gej(&local_480,&local_308);
      local_618.s[0] = 0x6a09e667;
      local_618.s[1] = 0xbb67ae85;
      local_618.s[2] = 0x3c6ef372;
      local_618.s[3] = 0xa54ff53a;
      local_618.s[4] = 0x510e527f;
      local_618.s[5] = 0x9b05688c;
      local_618.s[6] = 0x1f83d9ab;
      local_618.s[7] = 0x5be0cd19;
      local_618.bytes = 0;
      secp256k1_dleq_serialize_point((uchar *)&local_548,&local_428);
      secp256k1_sha256_write(&local_618,(uchar *)&local_548,0x21);
      secp256k1_dleq_serialize_point((uchar *)&local_548,&local_3d0);
      secp256k1_sha256_write(&local_618,(uchar *)&local_548,0x21);
      secp256k1_dleq_serialize_point((uchar *)&local_548,&local_480);
      secp256k1_sha256_write(&local_618,(uchar *)&local_548,0x21);
      secp256k1_sha256_finalize(&local_618,local_378);
      secp256k1_scalar_get_b32(local_358,&local_648);
      iVar36 = nonce_function_dleq(local_568,local_378,local_358,(uchar *)"ECDSAAdaptorSig");
      bVar34 = true;
      if ((iVar36 != 0) &&
         (secp256k1_scalar_set_b32(&local_5a8,local_568,(int *)0x0),
         ((local_5a8.d[1] != 0 || local_5a8.d[0] != 0) || local_5a8.d[2] != 0) ||
         local_5a8.d[3] != 0)) {
        secp256k1_ecmult_gen(ctx_00,&local_548,&local_5a8);
        secp256k1_ge_set_gej(&local_288,&local_548);
        secp256k1_ecmult_const(&local_308,&local_428,&local_5a8,0x100);
        secp256k1_ge_set_gej(&local_88,&local_308);
        secp256k1_dleq_challenge_hash
                  (&local_4c0,(uchar *)&local_428,&local_288,&local_88,&local_3d0,&local_480,
                   (secp256k1_ge *)adaptor_proof97);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_4c0.d[0];
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_648.d[0];
        uVar38 = SUB168(auVar1 * auVar17,8);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar38;
        local_1c8 = SUB168(auVar1 * auVar17,0);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_4c0.d[0];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_648.d[1];
        auVar2 = auVar2 * auVar18;
        uVar43 = SUB168(auVar2 + auVar33,0);
        uVar48 = SUB168(auVar2 + auVar33,8);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_4c0.d[1];
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_648.d[0];
        uVar39 = SUB168(auVar3 * auVar19,8);
        uVar37 = SUB168(auVar3 * auVar19,0);
        local_1c0 = uVar43 + uVar37;
        uVar37 = (ulong)CARRY8(uVar43,uVar37);
        uVar43 = uVar48 + uVar39;
        uVar49 = uVar43 + uVar37;
        uVar50 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar38,auVar2._0_8_)) +
                 (ulong)(CARRY8(uVar48,uVar39) || CARRY8(uVar43,uVar37));
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_4c0.d[0];
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_648.d[2];
        uVar40 = SUB168(auVar4 * auVar20,8);
        uVar37 = SUB168(auVar4 * auVar20,0);
        uVar38 = uVar49 + uVar37;
        uVar37 = (ulong)CARRY8(uVar49,uVar37);
        uVar39 = uVar50 + uVar40;
        uVar51 = uVar39 + uVar37;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_4c0.d[1];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_648.d[1];
        uVar41 = SUB168(auVar5 * auVar21,8);
        uVar43 = SUB168(auVar5 * auVar21,0);
        uVar49 = uVar38 + uVar43;
        uVar43 = (ulong)CARRY8(uVar38,uVar43);
        uVar48 = uVar51 + uVar41;
        uVar52 = uVar48 + uVar43;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_4c0.d[2];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_648.d[0];
        uVar42 = SUB168(auVar6 * auVar22,8);
        uVar38 = SUB168(auVar6 * auVar22,0);
        local_1b8 = uVar49 + uVar38;
        uVar38 = (ulong)CARRY8(uVar49,uVar38);
        uVar49 = uVar52 + uVar42;
        uVar53 = uVar49 + uVar38;
        uVar44 = (ulong)(CARRY8(uVar50,uVar40) || CARRY8(uVar39,uVar37)) +
                 (ulong)(CARRY8(uVar51,uVar41) || CARRY8(uVar48,uVar43)) +
                 (ulong)(CARRY8(uVar52,uVar42) || CARRY8(uVar49,uVar38));
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_4c0.d[0];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_648.d[3];
        uVar42 = SUB168(auVar7 * auVar23,8);
        uVar37 = SUB168(auVar7 * auVar23,0);
        uVar38 = uVar53 + uVar37;
        uVar37 = (ulong)CARRY8(uVar53,uVar37);
        uVar48 = uVar44 + uVar42;
        uVar53 = uVar48 + uVar37;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_4c0.d[1];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_648.d[2];
        uVar50 = SUB168(auVar8 * auVar24,8);
        uVar43 = SUB168(auVar8 * auVar24,0);
        uVar39 = uVar38 + uVar43;
        uVar43 = (ulong)CARRY8(uVar38,uVar43);
        uVar49 = uVar53 + uVar50;
        uVar45 = uVar49 + uVar43;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_4c0.d[2];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_648.d[1];
        uVar51 = SUB168(auVar9 * auVar25,8);
        uVar38 = SUB168(auVar9 * auVar25,0);
        uVar41 = uVar39 + uVar38;
        uVar38 = (ulong)CARRY8(uVar39,uVar38);
        uVar40 = uVar45 + uVar51;
        uVar46 = uVar40 + uVar38;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_4c0.d[3];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_648.d[0];
        uVar52 = SUB168(auVar10 * auVar26,8);
        uVar39 = SUB168(auVar10 * auVar26,0);
        local_1b0 = uVar41 + uVar39;
        uVar39 = (ulong)CARRY8(uVar41,uVar39);
        uVar41 = uVar46 + uVar52;
        uVar47 = uVar41 + uVar39;
        uVar50 = (ulong)(CARRY8(uVar44,uVar42) || CARRY8(uVar48,uVar37)) +
                 (ulong)(CARRY8(uVar53,uVar50) || CARRY8(uVar49,uVar43)) +
                 (ulong)(CARRY8(uVar45,uVar51) || CARRY8(uVar40,uVar38)) +
                 (ulong)(CARRY8(uVar46,uVar52) || CARRY8(uVar41,uVar39));
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_4c0.d[1];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_648.d[3];
        uVar40 = SUB168(auVar11 * auVar27,8);
        uVar37 = SUB168(auVar11 * auVar27,0);
        uVar38 = uVar47 + uVar37;
        uVar37 = (ulong)CARRY8(uVar47,uVar37);
        uVar39 = uVar50 + uVar40;
        uVar51 = uVar39 + uVar37;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_4c0.d[2];
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_648.d[2];
        uVar41 = SUB168(auVar12 * auVar28,8);
        uVar43 = SUB168(auVar12 * auVar28,0);
        uVar49 = uVar38 + uVar43;
        uVar43 = (ulong)CARRY8(uVar38,uVar43);
        uVar48 = uVar51 + uVar41;
        uVar52 = uVar48 + uVar43;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_4c0.d[3];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_648.d[1];
        uVar42 = SUB168(auVar13 * auVar29,8);
        uVar38 = SUB168(auVar13 * auVar29,0);
        local_1a8 = uVar49 + uVar38;
        uVar38 = (ulong)CARRY8(uVar49,uVar38);
        uVar49 = uVar52 + uVar42;
        uVar44 = uVar49 + uVar38;
        uVar40 = (ulong)(CARRY8(uVar50,uVar40) || CARRY8(uVar39,uVar37)) +
                 (ulong)(CARRY8(uVar51,uVar41) || CARRY8(uVar48,uVar43)) +
                 (ulong)(CARRY8(uVar52,uVar42) || CARRY8(uVar49,uVar38));
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_4c0.d[2];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = local_648.d[3];
        uVar48 = SUB168(auVar14 * auVar30,8);
        uVar37 = SUB168(auVar14 * auVar30,0);
        uVar39 = uVar44 + uVar37;
        uVar37 = (ulong)CARRY8(uVar44,uVar37);
        uVar38 = uVar40 + uVar48;
        uVar41 = uVar38 + uVar37;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_4c0.d[3];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = local_648.d[2];
        uVar49 = SUB168(auVar15 * auVar31,8);
        uVar43 = SUB168(auVar15 * auVar31,0);
        local_1a0 = uVar39 + uVar43;
        uVar43 = (ulong)CARRY8(uVar39,uVar43);
        uVar39 = uVar41 + uVar49;
        local_198._8_8_ =
             (ulong)(CARRY8(uVar40,uVar48) || CARRY8(uVar38,uVar37)) +
             (ulong)(CARRY8(uVar41,uVar49) || CARRY8(uVar39,uVar43));
        local_198._0_8_ = uVar39 + uVar43;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_4c0.d[3];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_648.d[3];
        local_198 = auVar16 * auVar32 + local_198;
        secp256k1_scalar_reduce_512(&local_4a0,&local_1c8);
        secp256k1_scalar_add(&local_4a0,&local_4a0,&local_5a8);
        local_5a8.d[2] = 0;
        local_5a8.d[3] = 0;
        local_5a8.d[0] = 0;
        local_5a8.d[1] = 0;
        bVar34 = false;
      }
      if (bVar34) {
        return 0;
      }
      secp256k1_ge_set_gej((secp256k1_ge *)&local_548,&local_108);
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_618,seckey32,(int *)&local_288);
      if ((int)local_288.x.n[0] != 0) {
        return 0;
      }
      if (((local_618.s._8_8_ == 0 && local_618.s._0_8_ == 0) && local_618.s._16_8_ == 0) &&
          local_618.s._24_8_ == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_3d0,msg32,(int *)0x0);
      iVar36 = secp256k1_ecdsa_adaptor_sign_helper
                         ((secp256k1_scalar *)&local_480,(secp256k1_scalar *)&local_3d0,&local_648,
                          (secp256k1_ge *)&local_548,(secp256k1_scalar *)&local_618);
      if (iVar36 == 0) {
        return 0;
      }
      secp256k1_ge_set_gej((secp256k1_ge *)&local_308,&local_188);
      secp256k1_ecdsa_adaptor_proof_serialize
                (adaptor_proof97,(secp256k1_ge *)&local_308,&local_4a0,&local_4c0);
      puVar35 = local_620;
      secp256k1_dleq_serialize_point(local_620,(secp256k1_ge *)&local_548);
      secp256k1_scalar_get_b32(puVar35 + 0x21,(secp256k1_scalar *)&local_480);
      return 1;
    }
    secp256k1_ecdsa_adaptor_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_sign(const secp256k1_context* ctx, unsigned char *adaptor_sig65, unsigned char *adaptor_proof97, unsigned char *seckey32, const secp256k1_pubkey *adaptor, const unsigned char *msg32) {
    unsigned char nonce32[32];
    unsigned char buf33[33];
    secp256k1_sha256 sha;
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge adaptor_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig65 != NULL);
    ARG_CHECK(adaptor_proof97 != NULL);
    ARG_CHECK(adaptor != NULL);
    ARG_CHECK(msg32 != NULL);

    /* 1. Choose k randomly, R' = k*G */
    /* Include msg32 and adaptor in nonce derivation */
    secp256k1_sha256_initialize(&sha);
    secp256k1_sha256_write(&sha, msg32, 32);
    if (!secp256k1_pubkey_load(ctx, &adaptor_ge, adaptor)) {
        return 0;
    }
    secp256k1_dleq_serialize_point(buf33, &adaptor_ge);
    secp256k1_sha256_write(&sha, buf33, 33);
    secp256k1_sha256_finalize(&sha, buf33);
    if (!nonce_function_dleq(nonce32, buf33, seckey32, (unsigned char *)"ECDSAAdaptorNon")) {
        return 0;
    }
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    if (secp256k1_scalar_is_zero(&k)) {
        return 0;
    }
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);

    /* 2. R = k*Y; */
    secp256k1_ecmult_const(&rj, &adaptor_ge, &k, 256);

    /* 4. [sic] proof = DLEQ_prove((G,R'),(Y, R)) */
    if (!secp256k1_dleq_proof(&ctx->ecmult_gen_ctx, &dleq_proof_s, &dleq_proof_e, (unsigned char *)"ECDSAAdaptorSig", &k, &adaptor_ge)) {
        return 0;
    }

    /* 5. s' = k⁻¹(H(m) + x_coord(R)x) */
    secp256k1_ge_set_gej(&r, &rj);
    secp256k1_scalar_set_b32(&sk, seckey32, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&sk)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if(!secp256k1_ecdsa_adaptor_sign_helper(&sp, &msg, &k, &r, &sk)) {
        secp256k1_scalar_clear(&k);
        secp256k1_scalar_clear(&sk);
        return 0;
    }

    /* 6. return (R, R', s', proof) */
    secp256k1_ge_set_gej(&rp, &rpj);
    secp256k1_ecdsa_adaptor_proof_serialize(adaptor_proof97, &rp, &dleq_proof_s, &dleq_proof_e);
    secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig65, &r, &sp);

    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    return 1;
}